

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::ClearDstUseForPostOpLazyBailOut(BackwardPass *this,Instr *instr)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *pSVar4;
  BailOutInfo *this_01;
  
  bVar2 = IR::Instr::HasLazyBailOut(instr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xb56,"(instr->HasLazyBailOut())","instr->HasLazyBailOut()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = instr->m_dst;
  if ((this_00 != (Opnd *)0x0) && (this->currentPrePassLoop == (Loop *)0x0)) {
    bVar2 = IR::Opnd::IsRegOpnd(this_00);
    if (bVar2) {
      pSVar4 = IR::Opnd::GetStackSym(this_00);
      if (pSVar4 != (StackSym *)0x0) {
        this_01 = IR::Instr::GetBailOutInfo(instr);
        BailOutInfo::ClearUseOfDst(this_01,(pSVar4->super_Sym).m_id);
        return;
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ClearDstUseForPostOpLazyBailOut(IR::Instr *instr)
{
    // Refer to comments on BailOutInfo::ClearUseOfDst()
    Assert(instr->HasLazyBailOut());
    IR::Opnd *dst = instr->GetDst();
    if (!this->IsPrePass() && dst && dst->IsRegOpnd())
    {
        StackSym *stackSym = dst->GetStackSym();
        if (stackSym) {
            instr->GetBailOutInfo()->ClearUseOfDst(stackSym->m_id);
        }
    }
}